

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_extended_msg(raft_server *this,req_msg *req)

{
  long *plVar1;
  element_type *peVar2;
  size_t sVar3;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ptr<resp_msg> pVar5;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  char local_98 [104];
  char *local_30;
  
  switch(*(uint *)(in_RDX + 0x10)) {
  case 6:
    pVar5 = handle_add_srv_req(this,req);
    _Var4 = pVar5.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  default:
    plVar1 = (long *)req[4].last_log_term_;
    local_30 = "receive an unknown request %s, for safety, step down.";
    snprintf(local_98,100,"receive an unknown request %s, for safety, step down.",
             __msg_type_str[*(uint *)(in_RDX + 0x10)]);
    local_b8[0] = local_a8;
    sVar3 = strlen(local_98);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,local_98,local_98 + sVar3);
    (**(code **)(*plVar1 + 0x28))(plVar1,local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    peVar2 = (((req->log_entries_).
               super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (**(code **)(peVar2->term_ + 0x40))(peVar2,0xffffffff);
    exit(-1);
  case 8:
    pVar5 = handle_rm_srv_req(this,req);
    _Var4 = pVar5.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case 10:
    pVar5 = handle_log_sync_req(this,req);
    _Var4 = pVar5.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case 0xc:
    pVar5 = handle_join_cluster_req(this,req);
    _Var4 = pVar5.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case 0xe:
    pVar5 = handle_leave_cluster_req(this,req);
    _Var4 = pVar5.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case 0x10:
    pVar5 = handle_install_snapshot_req(this,req);
    _Var4 = pVar5.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    break;
  case 0x12:
    pVar5 = handle_prevote_req(this,req);
    _Var4 = pVar5.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  pVar5.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  pVar5.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar5.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_extended_msg(req_msg& req)
{
    switch (req.get_type())
    {
        case msg_type::add_server_request:
            return handle_add_srv_req(req);
        case msg_type::remove_server_request:
            return handle_rm_srv_req(req);
        case msg_type::sync_log_request:
            return handle_log_sync_req(req);
        case msg_type::join_cluster_request:
            return handle_join_cluster_req(req);
        case msg_type::leave_cluster_request:
            return handle_leave_cluster_req(req);
        case msg_type::install_snapshot_request:
            return handle_install_snapshot_req(req);
        case msg_type::prevote_request:
            return handle_prevote_req(req);
        default:
            l_->err(
                sstrfmt("receive an unknown request %s, for safety, step down.").fmt(__msg_type_str[req.get_type()]));
            ctx_->state_mgr_->system_exit(-1);
            ::exit(-1);
            break;
    }

    return ptr<resp_msg>();
}